

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  double dVar4;
  bool local_7f;
  bool local_7e;
  bool local_7d;
  bool local_7c;
  bool local_7b;
  bool local_7a;
  bool local_79;
  bool local_69;
  string local_40;
  ValueType local_1c;
  Value *pVStack_18;
  ValueType other_local;
  Value *this_local;
  
  local_1c = other;
  pVStack_18 = this;
  switch(other) {
  case nullValue:
    bVar1 = isNumeric(this);
    bVar2 = false;
    if (bVar1) {
      dVar4 = asDouble(this);
      local_69 = true;
      if ((dVar4 != 0.0) || (NAN(dVar4))) goto LAB_00177320;
    }
    else {
LAB_00177320:
      if (((*(ushort *)&this->field_0x8 & 0xff) != 5) ||
         (local_69 = true, ((this->value_).bool_ & 1U) != 0)) {
        if ((*(ushort *)&this->field_0x8 & 0xff) == 4) {
          asString_abi_cxx11_(&local_40,this);
          bVar2 = true;
          bVar1 = std::operator==(&local_40,anon_var_dwarf_73d67 + 9);
          local_69 = true;
          if (bVar1) goto LAB_0017740e;
        }
        if ((*(ushort *)&this->field_0x8 & 0xff) == 6) {
          sVar3 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::size((this->value_).map_);
          local_69 = true;
          if (sVar3 == 0) goto LAB_0017740e;
        }
        if ((*(ushort *)&this->field_0x8 & 0xff) == 7) {
          sVar3 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::size((this->value_).map_);
          local_69 = true;
          if (sVar3 == 0) goto LAB_0017740e;
        }
        local_69 = (*(ushort *)&this->field_0x8 & 0xff) == 0;
      }
    }
LAB_0017740e:
    this_local._7_1_ = local_69;
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    break;
  case intValue:
    bVar2 = isInt(this);
    local_79 = true;
    if (!bVar2) {
      if ((*(ushort *)&this->field_0x8 & 0xff) == 3) {
        bVar2 = InRange<int,int>((this->value_).real_,-0x80000000,0x7fffffff);
        local_79 = true;
        if (bVar2) goto LAB_001774cb;
      }
      local_79 = true;
      if ((*(ushort *)&this->field_0x8 & 0xff) != 5) {
        local_79 = (*(ushort *)&this->field_0x8 & 0xff) == 0;
      }
    }
LAB_001774cb:
    this_local._7_1_ = local_79;
    break;
  case uintValue:
    bVar2 = isUInt(this);
    local_7a = true;
    if (!bVar2) {
      if ((*(ushort *)&this->field_0x8 & 0xff) == 3) {
        bVar2 = InRange<int,unsigned_int>((this->value_).real_,0,0xffffffff);
        local_7a = true;
        if (bVar2) goto LAB_00177552;
      }
      local_7a = true;
      if ((*(ushort *)&this->field_0x8 & 0xff) != 5) {
        local_7a = (*(ushort *)&this->field_0x8 & 0xff) == 0;
      }
    }
LAB_00177552:
    this_local._7_1_ = local_7a;
    break;
  case realValue:
    bVar2 = isNumeric(this);
    local_7b = true;
    if ((!bVar2) && (local_7b = true, (*(ushort *)&this->field_0x8 & 0xff) != 5)) {
      local_7b = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_7b;
    break;
  case stringValue:
    bVar2 = isNumeric(this);
    local_7d = true;
    if (((!bVar2) && (local_7d = true, (*(ushort *)&this->field_0x8 & 0xff) != 5)) &&
       (local_7d = true, (*(ushort *)&this->field_0x8 & 0xff) != 4)) {
      local_7d = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_7d;
    break;
  case booleanValue:
    bVar2 = isNumeric(this);
    local_7c = true;
    if ((!bVar2) && (local_7c = true, (*(ushort *)&this->field_0x8 & 0xff) != 5)) {
      local_7c = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_7c;
    break;
  case arrayValue:
    local_7e = true;
    if ((*(ushort *)&this->field_0x8 & 0xff) != 6) {
      local_7e = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_7e;
    break;
  case objectValue:
    local_7f = true;
    if ((*(ushort *)&this->field_0x8 & 0xff) != 7) {
      local_7f = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_7f;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x3c5,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool 
Value::isConvertibleTo( ValueType other ) const
{
   switch ( other )
   {
   case nullValue:
      return ( isNumeric() && asDouble() == 0.0 )
             || ( type_ == booleanValue && value_.bool_ == false )
             || ( type_ == stringValue && asString() == "" )
             || ( type_ == arrayValue && value_.map_->size() == 0 )
             || ( type_ == objectValue && value_.map_->size() == 0 )
             || type_ == nullValue;
   case intValue:
      return isInt()
             || (type_ == realValue && InRange(value_.real_, minInt, maxInt))
             || type_ == booleanValue
             || type_ == nullValue;
   case uintValue:
      return isUInt()
             || (type_ == realValue && InRange(value_.real_, 0, maxUInt))
             || type_ == booleanValue
             || type_ == nullValue;
   case realValue:
      return isNumeric()
             || type_ == booleanValue
             || type_ == nullValue;
   case booleanValue:
      return isNumeric()
             || type_ == booleanValue
             || type_ == nullValue;
   case stringValue:
      return isNumeric()
             || type_ == booleanValue
             || type_ == stringValue
             || type_ == nullValue;
   case arrayValue:
      return type_ == arrayValue
             || type_ == nullValue;
   case objectValue:
      return type_ == objectValue
             || type_ == nullValue;
   }
   JSON_ASSERT_UNREACHABLE;
   return false;
}